

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriIp4Base.c
# Opt level: O3

void uriStackToOctet(UriIp4Parser *parser,uchar *octet)

{
  uchar uVar1;
  
  uVar1 = parser->stackCount;
  if (uVar1 == '\x03') {
    uVar1 = parser->stackTwo * '\n' + parser->stackOne * 'd' + parser->stackThree;
  }
  else if (uVar1 == '\x02') {
    uVar1 = parser->stackOne * '\n' + parser->stackTwo;
  }
  else {
    if (uVar1 != '\x01') goto LAB_001b7ff4;
    uVar1 = parser->stackOne;
  }
  *octet = uVar1;
LAB_001b7ff4:
  parser->stackCount = '\0';
  return;
}

Assistant:

void uriStackToOctet(UriIp4Parser * parser, unsigned char * octet) {
	switch (parser->stackCount) {
	case 1:
		*octet = parser->stackOne;
		break;

	case 2:
		*octet = parser->stackOne * 10
				+ parser->stackTwo;
		break;

	case 3:
		*octet = parser->stackOne * 100
				+ parser->stackTwo * 10
				+ parser->stackThree;
		break;

	default:
		;
	}
	parser->stackCount = 0;
}